

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9Strash(Abc_Frame_t *pAbc,int argc,char **argv)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  Gia_Man_t *pGVar7;
  char *pcVar8;
  char *pcVar9;
  Vec_Int_t *pVVar10;
  uint local_44;
  uint local_40;
  uint local_3c;
  
  local_3c = 0;
  Extra_UtilGetoptReset();
  local_40 = 2;
  bVar3 = false;
  local_44 = 0;
  bVar2 = false;
  bVar1 = false;
LAB_0027a226:
  do {
    while( true ) {
      while (iVar4 = Extra_UtilGetopt(argc,argv,"Lacmrsh"), iVar5 = globalUtilOptind, iVar4 == 0x72)
      {
        bVar1 = (bool)(bVar1 ^ 1);
      }
      if (iVar4 < 99) break;
      if (iVar4 == 99) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else if (iVar4 == 0x6d) {
        local_44 = local_44 ^ 1;
      }
      else {
        if (iVar4 != 0x73) goto LAB_0027a41b;
        bVar2 = (bool)(bVar2 ^ 1);
      }
    }
    if (iVar4 == -1) {
      pGVar6 = pAbc->pGia;
      if (pGVar6 != (Gia_Man_t *)0x0) {
        pVVar10 = pGVar6->vMapping;
        if (bVar2) {
          if (pVVar10 != (Vec_Int_t *)0x0) {
            Abc_Print(0,"Restructing the current AIG destroys the LUT mapping.\n");
            pGVar6 = pAbc->pGia;
            pVVar10 = pGVar6->vMapping;
            if (pVVar10 != (Vec_Int_t *)0x0) {
              if (pVVar10->pArray != (int *)0x0) {
                free(pVVar10->pArray);
                pGVar6->vMapping->pArray = (int *)0x0;
                pVVar10 = pGVar6->vMapping;
                if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0027a350;
              }
              free(pVVar10);
              pGVar6->vMapping = (Vec_Int_t *)0x0;
            }
          }
LAB_0027a350:
          pGVar6 = Gia_ManDupMuxRestructure(pAbc->pGia);
          Abc_Print(1,
                    "Finished AIG restructing to enable efficient mapping of 4:1 MUXes into 4-LUTs.\n"
                   );
LAB_0027a536:
          if (bVar3) goto LAB_0027a53b;
          pGVar7 = pAbc->pGia;
        }
        else {
          if ((pVVar10 != (Vec_Int_t *)0x0) && (bVar1)) {
            pGVar6 = Gia_ManDupHashMapping(pGVar6);
            Gia_ManTransferPacking(pGVar6,pAbc->pGia);
            Gia_ManTransferTiming(pGVar6,pAbc->pGia);
            goto LAB_0027a536;
          }
          if (pVVar10 != (Vec_Int_t *)0x0) {
            if (pGVar6->vConfigs == (Vec_Int_t *)0x0) {
              pGVar6 = (Gia_Man_t *)Dsm_ManDeriveGia(pGVar6,local_44);
            }
            else {
              pGVar6 = (Gia_Man_t *)If_ManDeriveGiaFromCells(pGVar6);
            }
            goto LAB_0027a536;
          }
          if (local_44 != 0) {
            if (pGVar6->pMuxes != (uint *)0x0) {
              pcVar8 = "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n";
              goto LAB_0027a383;
            }
            pGVar6 = Gia_ManDupMuxes(pGVar6,local_40);
            pcVar8 = Abc_FrameReadFlag("silentmode");
            if (pcVar8 == (char *)0x0) {
              pcVar8 = "Generated AND/XOR/MUX graph.";
LAB_0027a6cb:
              puts(pcVar8);
            }
            goto LAB_0027a536;
          }
          if ((!bVar3) || (pGVar6->pAigExtra == (Gia_Man_t *)0x0)) {
            if (pGVar6->pMuxes == (uint *)0x0) {
              pGVar6 = Gia_ManRehash(pGVar6,local_3c);
            }
            else {
              pGVar6 = Gia_ManDupNoMuxes(pGVar6,0);
              pcVar8 = Abc_FrameReadFlag("silentmode");
              if (pcVar8 == (char *)0x0) {
                pcVar8 = "Generated AIG from AND/XOR/MUX graph.";
                goto LAB_0027a6cb;
              }
            }
            goto LAB_0027a536;
          }
          if (pGVar6->nBufs != 0) {
            __assert_fail("!Gia_ManBufNum(pAbc->pGia)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abci/abc.c"
                          ,0x7d61,"int Abc_CommandAbc9Strash(Abc_Frame_t *, int, char **)");
          }
          iVar5 = Gia_ManIsSeqWithBoxes(pGVar6);
          if ((iVar5 == 0) && (iVar5 = Gia_ManRegBoxNum(pAbc->pGia), iVar5 == 0)) {
            pGVar6 = Gia_ManDupCollapse(pAbc->pGia,pAbc->pGia->pAigExtra,(Vec_Int_t *)0x0,0);
          }
          else {
            pGVar7 = Gia_ManDupUnshuffleInputs(pAbc->pGia);
            Gia_ManTransferTiming(pGVar7,pAbc->pGia);
            pGVar6 = pGVar7->pAigExtra;
            iVar5 = Gia_ManRegBoxNum(pGVar7);
            pGVar6 = Gia_ManDupCollapse(pGVar7,pGVar6,(Vec_Int_t *)0x0,(uint)(0 < iVar5));
            Gia_ManTransferTiming(pAbc->pGia,pGVar7);
            Gia_ManStop(pGVar7);
          }
          pcVar8 = Abc_FrameReadFlag("silentmode");
          if (pcVar8 == (char *)0x0) {
            puts("Collapsed AIG with boxes and logic of the boxes.");
          }
LAB_0027a53b:
          pGVar7 = pAbc->pGia;
          if (pGVar7->pAigExtra != (Gia_Man_t *)0x0) goto LAB_0027a58d;
        }
        Gia_ManTransferTiming(pGVar6,pGVar7);
        pGVar7 = pAbc->pGia;
        pcVar8 = pGVar6->pCellStr;
        pGVar7->vConfigs = pGVar6->vConfigs;
        pGVar7->pCellStr = pcVar8;
        pGVar6->vConfigs = (Vec_Int_t *)0x0;
        pGVar6->pCellStr = (char *)0x0;
LAB_0027a58d:
        Abc_FrameUpdateGia(pAbc,pGVar6);
        return 0;
      }
      pcVar8 = "Abc_CommandAbc9Strash(): There is no AIG.\n";
LAB_0027a383:
      iVar5 = -1;
      goto LAB_0027a51c;
    }
    if (iVar4 != 0x4c) {
      if (iVar4 != 0x61) goto LAB_0027a41b;
      local_3c = local_3c ^ 1;
      goto LAB_0027a226;
    }
    if (argc <= globalUtilOptind) {
      Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
      goto LAB_0027a41b;
    }
    local_40 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = iVar5 + 1;
    if ((int)local_40 < 0) {
LAB_0027a41b:
      Abc_Print(-2,"usage: &st [-L num] [-acmrsh]\n");
      Abc_Print(-2,"\t         performs structural hashing\n");
      pcVar9 = "yes";
      pcVar8 = "yes";
      if (local_3c == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-a     : toggle additional hashing [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (!bVar3) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-c     : toggle collapsing hierarchical AIG [default = %s]\n",pcVar8);
      pcVar8 = "yes";
      if (local_44 == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-m     : toggle converting to larger gates [default = %s]\n",pcVar8);
      Abc_Print(-2,
                "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n"
                ,(ulong)local_40);
      Abc_Print(-2,"\t         (use L = 1 to create AIG with XORs but without MUXes)\n");
      pcVar8 = "yes";
      if (!bVar1) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n",
                pcVar8);
      if (!bVar2) {
        pcVar9 = "no";
      }
      Abc_Print(-2,"\t-s     : toggle using MUX restructuring [default = %s]\n",pcVar9);
      pcVar8 = "\t-h     : print the command usage\n";
      iVar5 = -2;
LAB_0027a51c:
      Abc_Print(iVar5,pcVar8);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Strash( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern Gia_Man_t * Gia_ManDupMuxRestructure( Gia_Man_t * p );
    Gia_Man_t * pTemp;
    int c, Limit = 2;
    int fAddStrash = 0;
    int fCollapse = 0;
    int fAddMuxes = 0;
    int fStrMuxes = 0;
    int fRehashMap = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Lacmrsh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            Limit = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( Limit < 0 )
                goto usage;
            break;
        case 'a':
            fAddStrash ^= 1;
            break;
        case 'c':
            fCollapse ^= 1;
            break;
        case 'm':
            fAddMuxes ^= 1;
            break;
        case 'r':
            fRehashMap ^= 1;
            break;
        case 's':
            fStrMuxes ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Strash(): There is no AIG.\n" );
        return 1;
    }
    if ( fStrMuxes )
    {
        if ( Gia_ManHasMapping(pAbc->pGia) )
            Abc_Print( 0, "Restructing the current AIG destroys the LUT mapping.\n" );
        Vec_IntFreeP( &pAbc->pGia->vMapping );
        pTemp = Gia_ManDupMuxRestructure( pAbc->pGia );
        Abc_Print( 1, "Finished AIG restructing to enable efficient mapping of 4:1 MUXes into 4-LUTs.\n" );
    }
    else if ( Gia_ManHasMapping(pAbc->pGia) && fRehashMap )
    {
        pTemp = Gia_ManDupHashMapping( pAbc->pGia );
        Gia_ManTransferPacking( pTemp, pAbc->pGia );
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
    }
    else if ( Gia_ManHasMapping(pAbc->pGia) && pAbc->pGia->vConfigs )
        pTemp = (Gia_Man_t *)If_ManDeriveGiaFromCells( pAbc->pGia );
    else if ( Gia_ManHasMapping(pAbc->pGia) )
        pTemp = (Gia_Man_t *)Dsm_ManDeriveGia( pAbc->pGia, fAddMuxes ); // delay-oriented unmapping
    else if ( fAddMuxes )
    {
        if ( pAbc->pGia->pMuxes )
        {
            Abc_Print( -1, "Abc_CommandAbc9Strash(): The AIG already has MUXes.\n" );
            return 1;
        }
        pTemp = Gia_ManDupMuxes( pAbc->pGia, Limit );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AND/XOR/MUX graph.\n" );
    }
    else if ( fCollapse && pAbc->pGia->pAigExtra )
    {
        assert( !Gia_ManBufNum(pAbc->pGia) );
        if ( Gia_ManIsSeqWithBoxes(pAbc->pGia) || Gia_ManRegBoxNum(pAbc->pGia) )
        {
            Gia_Man_t * pUnshuffled = Gia_ManDupUnshuffleInputs( pAbc->pGia );
            Gia_ManTransferTiming( pUnshuffled, pAbc->pGia );
            pTemp = Gia_ManDupCollapse( pUnshuffled, pUnshuffled->pAigExtra, NULL, Gia_ManRegBoxNum(pUnshuffled) > 0 );
            Gia_ManTransferTiming( pAbc->pGia, pUnshuffled );
            Gia_ManStop( pUnshuffled );
        }
        else
            pTemp = Gia_ManDupCollapse( pAbc->pGia, pAbc->pGia->pAigExtra, NULL, 0 );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Collapsed AIG with boxes and logic of the boxes.\n" );
    }
    else if ( pAbc->pGia->pMuxes )
    {
        pTemp = Gia_ManDupNoMuxes( pAbc->pGia, 0 );
        if ( !Abc_FrameReadFlag("silentmode") )
            printf( "Generated AIG from AND/XOR/MUX graph.\n" );
    }
    else
    {
        pTemp = Gia_ManRehash( pAbc->pGia, fAddStrash );
//        if ( !Abc_FrameReadFlag("silentmode") )
//            printf( "Rehashed the current AIG.\n" );
    }
    if ( !(fCollapse && pAbc->pGia->pAigExtra) )
    {
        Gia_ManTransferTiming( pTemp, pAbc->pGia );
        pAbc->pGia->vConfigs = pTemp->vConfigs;     pTemp->vConfigs = NULL;
        pAbc->pGia->pCellStr = pTemp->pCellStr;     pTemp->pCellStr = NULL;
    }
    Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &st [-L num] [-acmrsh]\n" );
    Abc_Print( -2, "\t         performs structural hashing\n" );
    Abc_Print( -2, "\t-a     : toggle additional hashing [default = %s]\n", fAddStrash? "yes": "no" );
    Abc_Print( -2, "\t-c     : toggle collapsing hierarchical AIG [default = %s]\n", fCollapse? "yes": "no" );
    Abc_Print( -2, "\t-m     : toggle converting to larger gates [default = %s]\n", fAddMuxes? "yes": "no" );
    Abc_Print( -2, "\t-L num : create MUX when sum of refs does not exceed this limit [default = %d]\n", Limit );
    Abc_Print( -2, "\t         (use L = 1 to create AIG with XORs but without MUXes)\n" );
    Abc_Print( -2, "\t-r     : toggle rehashing AIG while preserving mapping [default = %s]\n", fRehashMap? "yes": "no" );
    Abc_Print( -2, "\t-s     : toggle using MUX restructuring [default = %s]\n", fStrMuxes? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}